

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inequation.cpp
# Opt level: O3

void __thiscall inequation_True_Test::TestBody(inequation_True_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> ex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _func_int **message;
  ExprPtr EVar1;
  ExprPtr e;
  undefined1 local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  AssertHelper local_48;
  string local_40;
  impl local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  local_40._M_string_length = (size_type)operator_new(0x50);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_string_length)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_string_length)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_string_length)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00263778;
  local_40._M_dataplus._M_p = (pointer)(local_40._M_string_length + 0x10);
  *(undefined4 *)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_40._M_string_length + 0x10))->
    _vptr__Sp_counted_base = 2;
  *(undefined1 *)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_40._M_string_length + 0x40))->
    _M_use_count = 0;
  local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._M_pi)->
  _M_string_length = 0x100000001;
  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._M_pi)->
  _M_dataplus)._M_p = (pointer)&PTR___Sp_counted_ptr_inplace_00263778;
  local_58 = (undefined1  [8])
             &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._M_pi)
              ->field_2;
  *(undefined4 *)
   &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._M_pi)->field_2 =
       3;
  *(undefined1 *)
   &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
    ((long)local_50._M_pi + 0x40))->_M_string_length = 0;
  EVar1 = mathiu::impl::operator<(local_20,(ExprPtr *)&local_40,(ExprPtr *)local_58);
  ex = EVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
    ex._M_pi = extraout_RDX;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_string_length);
    ex._M_pi = extraout_RDX_00;
  }
  mathiu::impl::toString_abi_cxx11_(&local_40,local_20,(ExprPtr *)ex._M_pi);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)local_58,"toString(e)","\"true\"",&local_40,(char (*) [5])"true");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int **)0x21d6c4;
    }
    else {
      message = (_func_int **)((_Alloc_hider *)&(local_50._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/inequation.cpp"
               ,9,(char *)message);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_dataplus._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._M_pi
                );
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(inequation, Square6)
{
    auto const e1 = ("x"_s ^ 2_i) - 1_i;
    auto const e2 = (("x"_s - 3_i) ^ 2_i) - 3_i;;
    auto const e = e1 > e2;
    EXPECT_EQ(toString(solveInequation(e, "x"_s)), "(OOInterval 7/6 inf)");
}